

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

void __thiscall
TPZManVector<TPZEqnArray<double>,_10>::~TPZManVector(TPZManVector<TPZEqnArray<double>,_10> *this)

{
  TPZEqnArray<double> *pTVar1;
  long lVar2;
  long lVar3;
  
  (this->super_TPZVec<TPZEqnArray<double>_>)._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_019b5e30;
  if ((this->super_TPZVec<TPZEqnArray<double>_>).fStore == (TPZEqnArray<double> *)&this->field_0x20)
  {
    (this->super_TPZVec<TPZEqnArray<double>_>).fStore = (TPZEqnArray<double> *)0x0;
  }
  (this->super_TPZVec<TPZEqnArray<double>_>).fNAlloc = 0;
  lVar3 = 0x1c730;
  do {
    TPZEqnArray<double>::~TPZEqnArray
              ((TPZEqnArray<double> *)
               ((long)&(this->super_TPZVec<TPZEqnArray<double>_>)._vptr_TPZVec + lVar3));
    lVar3 = lVar3 + -0x3290;
  } while (lVar3 != -0x3270);
  (this->super_TPZVec<TPZEqnArray<double>_>)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_019b5e70;
  pTVar1 = (this->super_TPZVec<TPZEqnArray<double>_>).fStore;
  if (pTVar1 != (TPZEqnArray<double> *)0x0) {
    lVar3 = *(long *)&pTVar1[-1].fLastTerm;
    if (lVar3 != 0) {
      lVar2 = lVar3 * 0x3290;
      do {
        TPZEqnArray<double>::~TPZEqnArray
                  ((TPZEqnArray<double> *)
                   ((long)pTVar1[-1].fEqStart.super_TPZManVector<int,_100>.fExtAlloc + lVar2 + -0x28
                   ));
        lVar2 = lVar2 + -0x3290;
      } while (lVar2 != 0);
    }
    operator_delete__(&pTVar1[-1].fLastTerm,lVar3 * 0x3290 | 8);
    return;
  }
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::~TPZManVector() {
    if (this->fStore == fExtAlloc) {
        this->fStore = nullptr;
    }
    this->fNAlloc = 0;
}